

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explorer.hpp
# Opt level: O1

void explorer::DumpToFile<uttt::IBoard,uttt::IBoardWriter>
               (string *filename,vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *data)

{
  long lVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  vector<char,_std::allocator<char>_> bytes;
  char count_buf [8];
  ofstream file;
  vector<char,_std::allocator<char>_> local_258;
  undefined8 local_240;
  undefined1 local_238 [8];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  lVar4 = ((long)(data->super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(data->super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  lVar1 = 8;
  lVar3 = lVar4;
  do {
    local_238[lVar1 + -1] = (char)lVar3;
    lVar3 = lVar3 >> 8;
    lVar1 = lVar1 + -1;
  } while (lVar1 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Serializing ",0xc);
  poVar2 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," nodes...\n",10);
  lVar3 = std::chrono::_V2::system_clock::now();
  uttt::IBoardWriter::operator()(&local_258,(IBoardWriter *)&local_230,data);
  lVar1 = std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Serialization done: ",0x14);
  poVar2 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," nodes in ",10);
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"s ",2);
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"ms, ",4);
  local_240 = (double)((lVar1 - lVar3) / 1000000);
  poVar2 = std::ostream::_M_insert<double>(((double)lVar4 * 1000.0) / local_240);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," nps, ",6);
  lVar3 = (long)local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  auVar5._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar5._0_8_ = lVar3;
  auVar5._12_4_ = 0x45300000;
  poVar2 = std::ostream::_M_insert<double>
                     ((((auVar5._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) *
                       0.0009765625 * 1000.0 * 0.0009765625) / local_240);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," MB/s\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Writing ",8);
  poVar2 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," nodes to ",10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(filename->_M_dataplus)._M_p,filename->_M_string_length);
  local_230 = CONCAT71(local_230._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_230,1);
  lVar3 = std::chrono::_V2::system_clock::now();
  std::ofstream::ofstream(&local_230,(string *)filename,_S_bin);
  std::ostream::write((char *)&local_230,(long)local_238);
  std::ostream::write((char *)&local_230,
                      (long)local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
  lVar1 = std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Writing done: ",0xe);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," bytes in ",10);
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"s ",2);
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"ms, ",4);
  lVar4 = (long)local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  auVar6._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar6._0_8_ = lVar4;
  auVar6._12_4_ = 0x45300000;
  poVar2 = std::ostream::_M_insert<double>
                     ((((auVar6._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) *
                       0.0009765625 * 1000.0 * 0.0009765625) / (double)((lVar1 - lVar3) / 1000000));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," MB/s\n",6);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if (local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void
DumpToFile(const std::string &filename, const std::vector<IGame> &data)
{
    long long count = data.size();

    char count_buf[8];
    for (int i = 7; i >= 0; --i)
    {
        count_buf[i] = count & 0xff;
        count >>= 8;
    }

    count = data.size();

    std::cout << "Serializing " << count << " nodes...\n";
    auto t1 = std::chrono::high_resolution_clock::now();
    auto bytes = Writer()(data);
    auto t2 = std::chrono::high_resolution_clock::now();
    auto millis = std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count();
    std::cout << "Serialization done: " << count << " nodes in " << millis / 1000 << "s " << millis % 1000 << "ms, " << double(count) * 1000 / millis << " nps, " << double(bytes.size()) / 1024 * 1000 / 1024 / millis << " MB/s\n";

    std::cout << "Writing " << count << " nodes to " << filename << '\n';
    t1 = std::chrono::high_resolution_clock::now();
    std::ofstream file(filename, std::ios::binary);
    file.write(count_buf, 8);
    file.write(&bytes[0], bytes.size());
    t2 = std::chrono::high_resolution_clock::now();
    millis = std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count();
    std::cout << "Writing done: " << bytes.size() << " bytes in " << millis / 1000 << "s " << millis % 1000 << "ms, " << double(bytes.size()) / 1024 * 1000 / 1024 / millis << " MB/s\n";
}